

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

void duckdb::DictionaryCompression::SetDictionary
               (ColumnSegment *segment,BufferHandle *handle,StringDictionaryContainer container)

{
  data_ptr_t pdVar1;
  
  pdVar1 = BufferHandle::Ptr(handle);
  *(StringDictionaryContainer *)(pdVar1 + segment->offset) = container;
  return;
}

Assistant:

void DictionaryCompression::SetDictionary(ColumnSegment &segment, BufferHandle &handle,
                                          StringDictionaryContainer container) {
	auto header_ptr = reinterpret_cast<dictionary_compression_header_t *>(handle.Ptr() + segment.GetBlockOffset());
	Store<uint32_t>(container.size, data_ptr_cast(&header_ptr->dict_size));
	Store<uint32_t>(container.end, data_ptr_cast(&header_ptr->dict_end));
}